

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O3

bool __thiscall cmParseJacocoCoverage::ReadJacocoXML(cmParseJacocoCoverage *this,char *file)

{
  cmCTestCoverageHandlerContainer *pcVar1;
  cmCTest *pcVar2;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  cmXMLParser local_c8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  pcVar1 = this->Coverage;
  pcVar2 = this->CTest;
  cmXMLParser::cmXMLParser(&local_c8);
  local_c8._vptr_cmXMLParser = (_func_int **)&PTR__XMLParser_006996d0;
  local_98 = 0;
  local_90 = 0;
  local_78 = 0;
  local_70 = 0;
  local_58 = 0;
  local_50 = 0;
  local_d8 = SUB84(pcVar1,0);
  uStack_d4 = (undefined4)((ulong)pcVar1 >> 0x20);
  uStack_d0 = SUB84(pcVar2,0);
  local_40 = uStack_d0;
  uStack_3c = uStack_d4;
  uStack_38 = local_d8;
  uStack_34 = uStack_d4;
  local_a0 = &local_90;
  local_80 = &local_70;
  local_60 = &local_50;
  cmXMLParser::ParseFile(&local_c8,file);
  local_c8._vptr_cmXMLParser = (_func_int **)&PTR__XMLParser_006996d0;
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  cmXMLParser::~cmXMLParser(&local_c8);
  return true;
}

Assistant:

bool cmParseJacocoCoverage::ReadJacocoXML(const char* file)
{
  cmParseJacocoCoverage::XMLParser parser(this->CTest, this->Coverage);
  parser.ParseFile(file);
  return true;
}